

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::FieldDescriptorProto::ByteSizeLong(FieldDescriptorProto *this)

{
  bool bVar1;
  int32 iVar2;
  FieldDescriptorProto_Label value;
  FieldDescriptorProto_Type value_00;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  string *psVar4;
  size_t sVar5;
  size_t sStack_48;
  int cached_size;
  size_t total_size;
  FieldDescriptorProto *this_local;
  
  sStack_48 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = FieldDescriptorProto::unknown_fields(this);
    sStack_48 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      psVar4 = name_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(psVar4);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_extendee(this);
    if (bVar1) {
      psVar4 = extendee_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(psVar4);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_type_name(this);
    if (bVar1) {
      psVar4 = type_name_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(psVar4);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_default_value(this);
    if (bVar1) {
      psVar4 = default_value_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(psVar4);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_json_name(this);
    if (bVar1) {
      psVar4 = json_name_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(psVar4);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_options(this);
    if (bVar1) {
      sVar5 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FieldOptions>
                        (this->options_);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_number(this);
    if (bVar1) {
      iVar2 = number(this);
      sVar5 = internal::WireFormatLite::Int32Size(iVar2);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_oneof_index(this);
    if (bVar1) {
      iVar2 = oneof_index(this);
      sVar5 = internal::WireFormatLite::Int32Size(iVar2);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
  }
  if (((this->_has_bits_).has_bits_[0] & 0x300) != 0) {
    bVar1 = has_label(this);
    if (bVar1) {
      value = label(this);
      sVar5 = internal::WireFormatLite::EnumSize(value);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_type(this);
    if (bVar1) {
      value_00 = type(this);
      sVar5 = internal::WireFormatLite::EnumSize(value_00);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
  }
  iVar3 = internal::ToCachedSize(sStack_48);
  this->_cached_size_ = iVar3;
  return sStack_48;
}

Assistant:

size_t FieldDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldDescriptorProto)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 255u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional string extendee = 2;
    if (has_extendee()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->extendee());
    }

    // optional string type_name = 6;
    if (has_type_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->type_name());
    }

    // optional string default_value = 7;
    if (has_default_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->default_value());
    }

    // optional string json_name = 10;
    if (has_json_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->json_name());
    }

    // optional .google.protobuf.FieldOptions options = 8;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->options_);
    }

    // optional int32 number = 3;
    if (has_number()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->number());
    }

    // optional int32 oneof_index = 9;
    if (has_oneof_index()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->oneof_index());
    }

  }
  if (_has_bits_[8 / 32] & 768u) {
    // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
    if (has_label()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->label());
    }

    // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
    if (has_type()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}